

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O0

void __thiscall ProString::ProString(ProString *this,char *str)

{
  long lVar1;
  size_t sVar2;
  char **in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArrayView::QByteArrayView<const_char_*,_true>(in_stack_ffffffffffffffe0,in_RDI);
  QVar3.m_data = (storage_type *)in_stack_ffffffffffffffe0;
  QVar3.m_size = (qsizetype)in_RDI;
  QString::fromLatin1(QVar3);
  *(undefined4 *)(in_RDI + 3) = 0;
  sVar2 = qstrlen((char *)in_RDI);
  *(int *)((long)in_RDI + 0x1c) = (int)sVar2;
  *(undefined4 *)(in_RDI + 4) = 0;
  in_RDI[5] = (char *)0x80000000;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ProString::ProString(const char *str) :
    m_string(QString::fromLatin1(str)), m_offset(0), m_length(int(qstrlen(str))), m_file(0), m_hash(0x80000000)
{
}